

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O3

void Lms_ObjAreaMark_rec(Gia_Obj_t *pObj)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = *(ulong *)pObj;
  if (((uint)uVar1 & 0x9fffffff) != 0x9fffffff && (uVar1 >> 0x1e & 1) == 0) {
    do {
      *(ulong *)pObj = uVar1 | 0x40000000;
      Lms_ObjAreaMark_rec(pObj + -(uVar1 & 0x1fffffff));
      uVar2 = (ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff;
      uVar1 = *(ulong *)(pObj + -uVar2);
      if (((uint)uVar1 >> 0x1e & 1) != 0) {
        return;
      }
      pObj = pObj + -uVar2;
    } while (((uint)uVar1 & 0x9fffffff) != 0x9fffffff);
  }
  return;
}

Assistant:

void Lms_ObjAreaMark_rec( Gia_Obj_t * pObj )
{
    if ( pObj->fMark0 || Gia_ObjIsCi(pObj) )
        return;
    pObj->fMark0 = 1;
    Lms_ObjAreaMark_rec( Gia_ObjFanin0(pObj) );
    Lms_ObjAreaMark_rec( Gia_ObjFanin1(pObj) );
}